

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlValidateNMToken(xmlChar *value,int space)

{
  bool bVar1;
  int in_EAX;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  xmlChar *cur;
  int l;
  int local_34;
  
  if (value == (xmlChar *)0x0) {
    return -1;
  }
  pbVar5 = value;
  if (space == 0) {
    uVar2 = (uint)*value;
  }
  else {
    while( true ) {
      bVar6 = *pbVar5;
      uVar2 = (uint)bVar6;
      if ((0x20 < (ulong)bVar6) || ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) break;
      pbVar5 = pbVar5 + 1;
    }
  }
  if ((((byte)((byte)uVar2 - 0x30) < 10) || ((byte)(((byte)uVar2 & 0xdf) + 0xbf) < 0x1a)) ||
     ((uVar2 - 0x2d < 0x33 && ((0x4000000002003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) != 0)))) {
    pbVar5 = pbVar5 + 2;
    while (((bVar6 = pbVar5[-1], (byte)(bVar6 - 0x30) < 10 || ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a)
            ) || ((bVar6 - 0x2d < 0x33 &&
                  ((0x4000000002003U >> ((ulong)(bVar6 - 0x2d) & 0x3f) & 1) != 0))))) {
      pbVar5 = pbVar5 + 1;
    }
    if (space != 0) {
      while ((bVar6 < 0x21 && ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) != 0))) {
        bVar6 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      }
    }
    if (bVar6 == 0) {
      return 0;
    }
  }
  l = in_EAX;
  uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
  _l = CONCAT44(space,l);
  if (space == 0) {
    if (0xff < (int)uVar2) goto LAB_00181db4;
LAB_00181d6c:
    if (((uVar2 - 0xc0 < 0x17) ||
        ((((uVar2 & 0xffffffdf) - 0x41 < 0x1a || (uVar2 - 0x30 < 10)) || (0xf7 < (int)uVar2)))) ||
       (bVar1 = true, uVar2 - 0xd8 < 0x1f)) goto LAB_00181e30;
  }
  else {
    while ((int)uVar2 < 0x100) {
      if ((0x20 < uVar2) || ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) goto LAB_00181d6c;
      value = value + l;
      uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
    }
LAB_00181db4:
    iVar3 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
    if (((iVar3 != 0) || ((uVar2 - 0x3021 < 9 || uVar2 - 0x4e00 < 0x51a6) || uVar2 == 0x3007)) ||
       (iVar3 = xmlCharInRange(uVar2,&xmlIsDigitGroup), iVar3 != 0)) goto LAB_00181e30;
    bVar1 = false;
  }
  if ((0x32 < uVar2 - 0x2d) || ((0x4000000002003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) == 0)) {
    if (bVar1) {
      if (uVar2 != 0xb7) {
        return 1;
      }
    }
    else {
      iVar3 = xmlCharInRange(uVar2,&xmlIsCombiningGroup);
      if ((iVar3 == 0) && (iVar3 = xmlCharInRange(uVar2,&xmlIsExtenderGroup), iVar3 == 0)) {
        return 1;
      }
    }
  }
LAB_00181e30:
  value = value + l;
  uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
  if ((int)uVar2 < 0x100) {
    if (((uVar2 - 0xc0 < 0x17) || ((uVar2 & 0xffffffdf) - 0x41 < 0x1a)) ||
       ((uVar2 - 0x30 < 10 || ((0xf7 < (int)uVar2 || (uVar2 - 0xd8 < 0x1f)))))) goto LAB_00181e30;
  }
  else {
    iVar3 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
    if (((iVar3 != 0) || ((uVar2 - 0x3021 < 9 || uVar2 - 0x4e00 < 0x51a6) || uVar2 == 0x3007)) ||
       (iVar3 = xmlCharInRange(uVar2,&xmlIsDigitGroup), iVar3 != 0)) goto LAB_00181e30;
  }
  if ((0x32 < uVar2 - 0x2d) || ((0x4000000002003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) == 0)) {
    if ((int)uVar2 < 0x100) {
      uVar4 = (uint)(uVar2 == 0xb7);
    }
    else {
      iVar3 = xmlCharInRange(uVar2,&xmlIsCombiningGroup);
      if (iVar3 != 0) goto LAB_00181e30;
      uVar4 = xmlCharInRange(uVar2,&xmlIsExtenderGroup);
    }
    if (uVar4 == 0) {
      if (local_34 != 0) {
        while ((((int)uVar2 < 0x100 && (uVar2 < 0x21)) &&
               ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) != 0))) {
          value = value + l;
          uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&l);
        }
      }
      return (uint)(uVar2 != 0);
    }
  }
  goto LAB_00181e30;
}

Assistant:

int
xmlValidateNMToken(const xmlChar *value, int space) {
    const xmlChar *cur = value;
    int c,l;

    if (value == NULL)
        return(-1);
    /*
     * First quick algorithm for ASCII range
     */
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (((*cur >= 'a') && (*cur <= 'z')) ||
        ((*cur >= 'A') && (*cur <= 'Z')) ||
        ((*cur >= '0') && (*cur <= '9')) ||
        (*cur == '_') || (*cur == '-') || (*cur == '.') || (*cur == ':'))
	cur++;
    else
	goto try_complex;
    while (((*cur >= 'a') && (*cur <= 'z')) ||
	   ((*cur >= 'A') && (*cur <= 'Z')) ||
	   ((*cur >= '0') && (*cur <= '9')) ||
	   (*cur == '_') || (*cur == '-') || (*cur == '.') || (*cur == ':'))
	cur++;
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == 0)
	return(0);

try_complex:
    /*
     * Second check for chars outside the ASCII range
     */
    cur = value;
    c = CUR_SCHAR(cur, l);
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (!(IS_LETTER(c) || IS_DIGIT(c) || (c == '.') || (c == ':') ||
        (c == '-') || (c == '_') || IS_COMBINING(c) || IS_EXTENDER(c)))
	return(1);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') || (c == ':') ||
	   (c == '-') || (c == '_') || IS_COMBINING(c) || IS_EXTENDER(c)) {
	cur += l;
	c = CUR_SCHAR(cur, l);
    }
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (c != 0)
	return(1);
    return(0);
}